

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
update_current(segment_index_iterator<std::_List_iterator<wchar_t>_> *this,
              pair<unsigned_long,_unsigned_long> pos)

{
  element_type *peVar1;
  long lVar2;
  size_t sVar3;
  unsigned_long uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  difference_type __d;
  unsigned_long uVar10;
  pointer pbVar11;
  pointer pbVar12;
  long lVar13;
  _List_node_base *p_Var14;
  
  uVar9 = pos.second;
  uVar10 = pos.first;
  peVar1 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = (long)(peVar1->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (peVar1->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pbVar12 - lVar2 >> 4;
  pbVar12 = pbVar12 + -1;
  pbVar11 = (pointer)(uVar10 * 0x10 + lVar2);
  if (uVar8 == uVar10) {
    pbVar11 = pbVar12;
  }
  sVar3 = pbVar11->offset;
  uVar4 = (this->current_).first;
  pbVar11 = (pointer)(uVar4 * 0x10 + lVar2);
  if (uVar8 == uVar4) {
    pbVar11 = pbVar12;
  }
  sVar5 = pbVar11->offset;
  pbVar11 = (pointer)(lVar2 + uVar9 * 0x10);
  if (uVar8 == uVar9) {
    pbVar11 = pbVar12;
  }
  uVar4 = (this->current_).second;
  sVar6 = pbVar11->offset;
  pbVar11 = (pointer)(uVar4 * 0x10 + lVar2);
  if (uVar8 == uVar4) {
    pbVar11 = pbVar12;
  }
  sVar7 = pbVar11->offset;
  if (sVar3 == sVar5 || (long)(sVar3 - sVar5) < 0) {
    if (sVar3 != sVar5) {
      p_Var14 = (this->value_).
                super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>.first.
                _M_node;
      lVar13 = sVar5 - sVar3;
      do {
        p_Var14 = p_Var14->_M_prev;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      goto LAB_00123cbd;
    }
  }
  else {
    p_Var14 = (this->value_).super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>
              .first._M_node;
    lVar13 = sVar5 - sVar3;
    do {
      p_Var14 = p_Var14->_M_next;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0);
LAB_00123cbd:
    (this->value_).super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>.first.
    _M_node = p_Var14;
  }
  if (sVar6 == sVar7 || (long)(sVar6 - sVar7) < 0) {
    if (sVar6 == sVar7) goto LAB_00123cec;
    p_Var14 = (this->value_).super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>
              .second._M_node;
    lVar13 = sVar7 - sVar6;
    do {
      p_Var14 = p_Var14->_M_prev;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  else {
    p_Var14 = (this->value_).super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>
              .second._M_node;
    lVar13 = sVar7 - sVar6;
    do {
      p_Var14 = p_Var14->_M_next;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0);
  }
  (this->value_).super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>.second.
  _M_node = p_Var14;
LAB_00123cec:
  (this->current_).first = uVar10;
  (this->current_).second = uVar9;
  if (uVar8 != uVar9) {
    (this->value_).rule_ = *(rule_type *)(lVar2 + 8 + uVar9 * 0x10);
  }
  return;
}

Assistant:

index_type const &index() const
                    {
                        return map_->index();
                    }